

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

void setfield(lua_State *L,char *key,int value,int delta)

{
  int delta_local;
  int value_local;
  char *key_local;
  lua_State *L_local;
  
  lua_pushinteger(L,(long)value + (long)delta);
  lua_setfield(L,-2,key);
  return;
}

Assistant:

static void setfield (lua_State *L, const char *key, int value, int delta) {
  #if (defined(LUA_NUMTIME) && LUA_MAXINTEGER <= INT_MAX)
    if (l_unlikely(value > LUA_MAXINTEGER - delta))
      luaL_error(L, "field '%s' is out-of-bound", key);
  #endif
  lua_pushinteger(L, (lua_Integer)value + delta);
  lua_setfield(L, -2, key);
}